

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecCore.c
# Opt level: O0

void Acec_VerifyClasses(Gia_Man_t *p,Vec_Wec_t *vLits,Vec_Wec_t *vReprs)

{
  int iVar1;
  int iVar2;
  Vec_Wrd_t *p_00;
  word wVar3;
  word wVar4;
  word Truth2;
  word Truth_1;
  Vec_Wrd_t *vTruths_1;
  word Truth;
  Vec_Wrd_t *vTruths;
  uint local_58;
  int nErrors;
  int nOvers;
  int Entry2;
  int Entry;
  int k;
  int j;
  int i;
  Vec_Int_t *vLevel;
  Vec_Wrd_t *vTemp;
  Vec_Int_t *vSupp;
  Vec_Ptr_t *vFunc;
  Vec_Wec_t *vReprs_local;
  Vec_Wec_t *vLits_local;
  Gia_Man_t *p_local;
  
  vFunc = (Vec_Ptr_t *)vReprs;
  vReprs_local = vLits;
  vLits_local = (Vec_Wec_t *)p;
  iVar1 = Vec_WecSize(vLits);
  vSupp = (Vec_Int_t *)Vec_PtrAlloc(iVar1);
  vTemp = (Vec_Wrd_t *)Vec_IntAlloc(100);
  iVar1 = Gia_ManObjNum((Gia_Man_t *)vLits_local);
  vLevel = (Vec_Int_t *)Vec_WrdStart(iVar1);
  local_58 = 0;
  vTruths._4_4_ = 0;
  for (k = 0; iVar1 = k, iVar2 = Vec_WecSize(vReprs_local), iVar1 < iVar2; k = k + 1) {
    _j = Vec_WecEntry(vReprs_local,k);
    iVar1 = Vec_IntSize(_j);
    Truth = (word)Vec_WrdAlloc(iVar1);
    for (Entry2 = 0; iVar1 = Entry2, iVar2 = Vec_IntSize(_j), iVar1 < iVar2; Entry2 = Entry2 + 1) {
      nOvers = Vec_IntEntry(_j,Entry2);
      vTruths_1 = (Vec_Wrd_t *)
                  Gia_ObjComputeTruth6Cis
                            ((Gia_Man_t *)vLits_local,nOvers,(Vec_Int_t *)vTemp,(Vec_Wrd_t *)vLevel)
      ;
      iVar1 = Vec_IntSize((Vec_Int_t *)vTemp);
      if (iVar1 < 7) {
        iVar1 = Abc_Tt6MinBase((word *)&vTruths_1,(int *)vTemp->pArray,vTemp->nSize);
        vTemp->nSize = iVar1;
        iVar1 = Vec_IntSize((Vec_Int_t *)vTemp);
        if (iVar1 < 6) {
          Vec_WrdPush((Vec_Wrd_t *)Truth,(word)vTruths_1);
        }
        else {
          local_58 = local_58 + 1;
          Vec_WrdPush((Vec_Wrd_t *)Truth,0x1234567812345678);
        }
      }
      else {
        local_58 = local_58 + 1;
        Vec_WrdPush((Vec_Wrd_t *)Truth,0x1234567812345678);
      }
    }
    Vec_PtrPush((Vec_Ptr_t *)vSupp,(void *)Truth);
  }
  if (local_58 != 0) {
    printf("Detected %d oversize support nodes.\n",(ulong)local_58);
  }
  Vec_IntFree((Vec_Int_t *)vTemp);
  Vec_WrdFree((Vec_Wrd_t *)vLevel);
  for (k = 0; iVar1 = k, iVar2 = Vec_WecSize((Vec_Wec_t *)vFunc), iVar1 < iVar2; k = k + 1) {
    _j = Vec_WecEntry((Vec_Wec_t *)vFunc,k);
    p_00 = (Vec_Wrd_t *)Vec_PtrEntry((Vec_Ptr_t *)vSupp,k);
    for (Entry2 = 0; iVar1 = Entry2, iVar2 = Vec_IntSize(_j), iVar1 < iVar2; Entry2 = Entry2 + 1) {
      nOvers = Vec_IntEntry(_j,Entry2);
      Entry = Entry2;
      while( true ) {
        Entry = Entry + 1;
        iVar1 = Entry;
        iVar2 = Vec_IntSize(_j);
        if (iVar2 <= iVar1) break;
        nErrors = Vec_IntEntry(_j,Entry);
        wVar3 = Vec_WrdEntry(p_00,Entry2);
        wVar4 = Vec_WrdEntry(p_00,Entry);
        if ((((nOvers == nErrors) && (vTruths._4_4_ = vTruths._4_4_ + 1, wVar3 != wVar4)) &&
            (wVar3 != 0x1234567812345678)) && (wVar4 != 0x1234567812345678)) {
          printf("Rank %d:  Lit %d and %d do not pass verification.\n",(ulong)(uint)k,
                 (ulong)(uint)Entry2,(ulong)(uint)Entry);
        }
        iVar1 = nOvers;
        iVar2 = Abc_LitNot(nErrors);
        if (((iVar1 == iVar2) &&
            (vTruths._4_4_ = vTruths._4_4_ + 1, wVar3 != (wVar4 ^ 0xffffffffffffffff))) &&
           ((wVar3 != 0x1234567812345678 && (wVar4 != 0x1234567812345678)))) {
          printf("Rank %d:  Lit %d and %d do not pass verification.\n",(ulong)(uint)k,
                 (ulong)(uint)Entry2,(ulong)(uint)Entry);
        }
      }
    }
  }
  if (vTruths._4_4_ != 0) {
    printf("Total errors in equivalence classes = %d.\n",(ulong)vTruths._4_4_);
  }
  Vec_VecFree((Vec_Vec_t *)vSupp);
  return;
}

Assistant:

void Acec_VerifyClasses( Gia_Man_t * p, Vec_Wec_t * vLits, Vec_Wec_t * vReprs )
{
    Vec_Ptr_t * vFunc = Vec_PtrAlloc( Vec_WecSize(vLits) );
    Vec_Int_t * vSupp = Vec_IntAlloc( 100 );
    Vec_Wrd_t * vTemp = Vec_WrdStart( Gia_ManObjNum(p) );
    Vec_Int_t * vLevel;
    int i, j, k, Entry, Entry2, nOvers = 0, nErrors = 0;
    Vec_WecForEachLevel( vLits, vLevel, i )
    {
        Vec_Wrd_t * vTruths = Vec_WrdAlloc( Vec_IntSize(vLevel) );
        Vec_IntForEachEntry( vLevel, Entry, k )
        {
            word Truth = Gia_ObjComputeTruth6Cis( p, Entry, vSupp, vTemp );
            if ( Vec_IntSize(vSupp) > 6  )
            {
                nOvers++;
                Vec_WrdPush( vTruths, TRUTH_UNUSED );
                continue;
            }
            vSupp->nSize = Abc_Tt6MinBase( &Truth, vSupp->pArray, vSupp->nSize );
            if ( Vec_IntSize(vSupp) > 5  )
            {
                nOvers++;
                Vec_WrdPush( vTruths, TRUTH_UNUSED );
                continue;
            }
            Vec_WrdPush( vTruths, Truth );
        }
        Vec_PtrPush( vFunc, vTruths );
    }
    if ( nOvers )
        printf( "Detected %d oversize support nodes.\n", nOvers );
    Vec_IntFree( vSupp );
    Vec_WrdFree( vTemp );
    // verify the classes
    Vec_WecForEachLevel( vReprs, vLevel, i )
    {
        Vec_Wrd_t * vTruths = (Vec_Wrd_t *)Vec_PtrEntry( vFunc, i );
        Vec_IntForEachEntry( vLevel, Entry, k )
        Vec_IntForEachEntryStart( vLevel, Entry2, j, k+1 )
        {
            word Truth = Vec_WrdEntry( vTruths, k );
            word Truth2 = Vec_WrdEntry( vTruths, j );
            if ( Entry == Entry2 )
            {
                nErrors++;
                if ( Truth != Truth2 && Truth != TRUTH_UNUSED && Truth2 != TRUTH_UNUSED )
                    printf( "Rank %d:  Lit %d and %d do not pass verification.\n", i, k, j );
            }
            if ( Entry == Abc_LitNot(Entry2) )
            {
                nErrors++;
                if ( Truth != ~Truth2 && Truth != TRUTH_UNUSED && Truth2 != TRUTH_UNUSED )
                    printf( "Rank %d:  Lit %d and %d do not pass verification.\n", i, k, j );
            }
        }
    }
    if ( nErrors )
        printf( "Total errors in equivalence classes = %d.\n", nErrors );
    Vec_VecFree( (Vec_Vec_t *)vFunc );
}